

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzer.cpp
# Opt level: O0

void __thiscall
MidiAnalyzer::dataParameter(MidiAnalyzer *this,U8 mData,MidiFrameType *mFrameType,stash *mStash1)

{
  stash *mStash1_local;
  MidiFrameType *mFrameType_local;
  U8 mData_local;
  MidiAnalyzer *this_local;
  
  mStash1->channel = -2;
  *mFrameType = Data;
  if (this->distanceFromLastCommandPacket == 1) {
    mStash1->channel = (S8)this->dataFrameCorrespondingChannel;
    switch(this->lastCommandPacketType) {
    case NoteOff:
      *mFrameType = Key;
      break;
    case NoteOn:
      *mFrameType = Key;
      break;
    case Aftertouch:
      *mFrameType = Key;
      break;
    case ContinuousController:
      *mFrameType = ControllerNum;
      break;
    case PatchChange:
      *mFrameType = InstrumentNum;
      break;
    case ChannelPressure:
      *mFrameType = Pressure;
      break;
    case PitchBend:
      *mFrameType = LSB;
      break;
    default:
      *mFrameType = error;
    }
  }
  else if (this->distanceFromLastCommandPacket == 2) {
    mStash1->channel = (S8)this->dataFrameCorrespondingChannel;
    switch(this->lastCommandPacketType) {
    case NoteOff:
      *mFrameType = Velocity;
      break;
    case NoteOn:
      *mFrameType = Velocity;
      break;
    case Aftertouch:
      *mFrameType = Touch;
      break;
    case ContinuousController:
      *mFrameType = ControllerValue;
      break;
    case PatchChange:
      *mFrameType = error;
      break;
    case ChannelPressure:
      *mFrameType = error;
      break;
    case PitchBend:
      *mFrameType = MSB;
      break;
    default:
      *mFrameType = error;
    }
  }
  else {
    *mFrameType = orphanedData;
  }
  return;
}

Assistant:

void MidiAnalyzer::dataParameter( U8 mData, enum MidiFrameType* mFrameType, union stash* mStash1 )
{
    ( *mStash1 ).channel = -2; // Channel is not stored in a data byte.
    *mFrameType = Data;
    if( distanceFromLastCommandPacket == 1 )
    { // First parameter
        ( *mStash1 ).channel = dataFrameCorrespondingChannel;
        switch( lastCommandPacketType )
        {
        case NoteOff:
            *mFrameType = Key;
            break;
        case NoteOn:
            *mFrameType = Key;
            break;
        case Aftertouch:
            *mFrameType = Key;
            break;
        case ContinuousController:
            *mFrameType = ControllerNum;
            break;
        case PatchChange:
            *mFrameType = InstrumentNum;
            break;
        case ChannelPressure:
            *mFrameType = Pressure;
            break;
        case PitchBend:
            *mFrameType = LSB;
            break;
        default:
            *mFrameType = error;
            break;
        }
    }
    else if( distanceFromLastCommandPacket == 2 )
    { // Second parameter
        ( *mStash1 ).channel = dataFrameCorrespondingChannel;
        switch( lastCommandPacketType )
        {
        case NoteOff:
            *mFrameType = Velocity;
            break;
        case NoteOn:
            *mFrameType = Velocity;
            break;
        case Aftertouch:
            *mFrameType = Touch;
            break;
        case ContinuousController:
            *mFrameType = ControllerValue;
            break;
        case PatchChange:
            *mFrameType = error;
            break;
        case ChannelPressure:
            *mFrameType = error;
            break;
        case PitchBend:
            *mFrameType = MSB;
            break;
        default:
            *mFrameType = error;
            break;
        }
    }
    else
    {
        *mFrameType = orphanedData;
    }
}